

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

void __thiscall CoreML::ShapeRange::setValue(ShapeRange *this,RangeValue *val)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  string local_1d0 [32];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [392];
  RangeValue *local_18;
  RangeValue *val_local;
  ShapeRange *this_local;
  
  local_18 = val;
  val_local = &this->_minimum;
  bVar1 = RangeValue::isUnbound(val);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Can\'t set shape range to have value \'unbound\'.");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = isValid(this,local_18);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar2 = std::operator<<(local_1a0,"Invalid setValue ");
    poVar2 = ::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2," for range: ");
    poVar2 = ::operator<<(poVar2,this);
    std::operator<<(poVar2,"\n");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1d0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  RangeValue::set(&this->_minimum,local_18);
  RangeValue::set(&this->_maximum,local_18);
  return;
}

Assistant:

void ShapeRange::setValue(const RangeValue& val) {
    if (val.isUnbound())
        throw std::runtime_error("Can't set shape range to have value 'unbound'.");

    if (isValid(val)) {
        _minimum.set(val);
        _maximum.set(val);
    }
    else {
        std::stringstream ss;
        ss << "Invalid setValue " << val << " for range: " << *this << "\n";
        throw std::runtime_error(ss.str());
    }
}